

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase1253::run(TestCase1253 *this)

{
  ListElementCount LVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  uint i;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  Orphanage OVar8;
  Builder BVar9;
  Reader RVar10;
  ReaderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> reader;
  BuilderFor<capnp::List<unsigned_int,_(capnp::Kind)0>_> builder;
  MallocMessageBuilder message;
  uint local_1c0;
  ListElementCount local_1bc;
  ListReader local_1b8;
  OrphanBuilder local_188;
  OrphanBuilder local_168;
  ListBuilder local_148;
  MallocMessageBuilder local_120;
  long lVar7;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_120,0x400,GROW_HEURISTICALLY);
  OVar8 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initList((OrphanBuilder *)&local_1b8,OVar8.arena,OVar8.capTable,7,FOUR_BYTES);
  local_168.segment = (SegmentBuilder *)local_1b8.capTable;
  local_168.capTable = (CapTableBuilder *)local_1b8.ptr;
  local_168.tag.content = (uint64_t)local_1b8.segment;
  OrphanBuilder::asList(&local_148,&local_168,FOUR_BYTES);
  auVar2 = _DAT_002b7a00;
  lVar4 = -8;
  uVar5 = 0;
  auVar6 = _DAT_002b79f0;
  do {
    if (SUB164(auVar6 ^ auVar2,4) == -0x80000000 && SUB164(auVar6 ^ auVar2,0) < -0x7ffffff9) {
      *(int *)(local_148.ptr + (uVar5 >> 3)) = (int)lVar4 + 0x75bcd1d;
      *(int *)(local_148.ptr + (local_148.step + uVar5 >> 3)) = (int)lVar4 + 0x75bcd1e;
    }
    lVar7 = auVar6._8_8_;
    auVar6._0_8_ = auVar6._0_8_ + 2;
    auVar6._8_8_ = lVar7 + 2;
    uVar5 = uVar5 + (ulong)local_148.step * 2;
    lVar4 = lVar4 + 2;
  } while (lVar4 != 0);
  OVar8 = MessageBuilder::getOrphanage(&local_120.super_MessageBuilder);
  OrphanBuilder::initData((OrphanBuilder *)&local_1b8,OVar8.arena,OVar8.capTable,1);
  local_188.segment = (SegmentBuilder *)local_1b8.capTable;
  local_188.capTable = (CapTableBuilder *)local_1b8.ptr;
  local_188.tag.content = (uint64_t)local_1b8.segment;
  BVar9 = OrphanBuilder::asData(&local_188);
  *BVar9.super_ArrayPtr<unsigned_char>.ptr = ' ';
  OrphanBuilder::truncate(&local_168,(char *)0xb,4);
  OrphanBuilder::asListReader(&local_1b8,&local_168,FOUR_BYTES);
  if ((local_1b8.elementCount != 0xb) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0xb;
    local_1bc = local_1b8.elementCount;
    kj::_::Debug::log<char_const(&)[41],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x4f3,ERROR,"\"failed: expected \" \"(11) == (reader.size())\", 11, reader.size()",
               (char (*) [41])"failed: expected (11) == (reader.size())",(int *)&local_1c0,
               &local_1bc);
  }
  uVar5 = 0x75bcd15;
  do {
    uVar3 = (ulong)local_1b8.step * (uVar5 - 0x75bcd15) >> 3;
    if (kj::_::Debug::minSeverity < 3 &&
        uVar5 != *(uint *)((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar3))
    {
      local_1c0 = (uint)uVar5;
      local_1bc = *(ListElementCount *)
                   ((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar3);
      kj::_::Debug::log<char_const(&)[48],unsigned_int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f6,ERROR,
                 "\"failed: expected \" \"(123456789 + i) == (reader[i])\", 123456789 + i, reader[i]"
                 ,(char (*) [48])"failed: expected (123456789 + i) == (reader[i])",&local_1c0,
                 &local_1bc);
    }
    uVar3 = (uVar5 - 0x75bcd15) * (ulong)local_148.step >> 3;
    if ((*(int *)(local_148.ptr + uVar3) != 0) && (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = 0;
      local_1bc = *(ListElementCount *)(local_148.ptr + uVar3);
      kj::_::Debug::log<char_const(&)[37],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4f7,ERROR,"\"failed: expected \" \"(0) == (builder[i])\", 0, builder[i]",
                 (char (*) [37])"failed: expected (0) == (builder[i])",(int *)&local_1c0,&local_1bc)
      ;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x75bcd1c);
  lVar4 = 7;
  do {
    uVar5 = (ulong)local_1b8.step * lVar4 >> 3;
    if ((*(int *)((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar5) != 0) &&
       (kj::_::Debug::minSeverity < 3)) {
      local_1c0 = 0;
      local_1bc = *(ListElementCount *)
                   ((long)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader + uVar5);
      kj::_::Debug::log<char_const(&)[36],int,unsigned_int>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x4fa,ERROR,"\"failed: expected \" \"(0) == (reader[i])\", 0, reader[i]",
                 (char (*) [36])"failed: expected (0) == (reader[i])",(int *)&local_1c0,&local_1bc);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0xb);
  local_148.ptr[0] = 'A';
  local_148.ptr[1] = '\x01';
  local_148.ptr[2] = '\0';
  local_148.ptr[3] = '\0';
  LVar1 = *(ListElementCount *)&((CapTableReader *)local_1b8.ptr)->_vptr_CapTableReader;
  if ((LVar1 != 0x75bcd15) && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0x75bcd15;
    local_1bc = LVar1;
    kj::_::Debug::log<char_const(&)[44],int,unsigned_int>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x500,ERROR,
               "\"failed: expected \" \"(123456789) == (reader[0])\", 123456789, reader[0]",
               (char (*) [44])"failed: expected (123456789) == (reader[0])",(int *)&local_1c0,
               &local_1bc);
  }
  RVar10 = OrphanBuilder::asDataReader(&local_188);
  if ((*RVar10.super_ArrayPtr<const_unsigned_char>.ptr != ' ') && (kj::_::Debug::minSeverity < 3)) {
    local_1c0 = 0x20;
    RVar10 = OrphanBuilder::asDataReader(&local_188);
    kj::_::Debug::log<char_const(&)[50],int,unsigned_char_const&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x502,ERROR,
               "\"failed: expected \" \"(32) == (orphan2.getReader()[0])\", 32, orphan2.getReader()[0]"
               ,(char (*) [50])"failed: expected (32) == (orphan2.getReader()[0])",(int *)&local_1c0
               ,RVar10.super_ArrayPtr<const_unsigned_char>.ptr);
  }
  if (local_188.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_188);
  }
  if (local_168.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_168);
  }
  MallocMessageBuilder::~MallocMessageBuilder(&local_120);
  return;
}

Assistant:

TEST(Orphans, ExtendPrimitiveListCopy) {
  MallocMessageBuilder message;
  auto orphan = message.getOrphanage().newOrphan<List<uint32_t>>(7);
  auto builder = orphan.get();
  for (uint i = 0; i < 7; i++) {
    builder.set(i, 123456789 + i);
  }

  auto orphan2 = message.getOrphanage().newOrphan<Data>(1);
  orphan2.get()[0] = 32;

  orphan.truncate(11);

  auto reader = orphan.getReader();
  EXPECT_EQ(11, reader.size());

  for (uint i = 0; i < 7; i++) {
    EXPECT_EQ(123456789 + i, reader[i]);
    EXPECT_EQ(0, builder[i]);
  }
  for (uint i = 7; i < 11; i++) {
    EXPECT_EQ(0, reader[i]);
  }

  // Can't compare pointers directly, but we can check if builder modifications are visible using
  // the reader.
  builder.set(0, 321);
  EXPECT_EQ(123456789, reader[0]);

  EXPECT_EQ(32, orphan2.getReader()[0]);
}